

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_frontend_test.cpp
# Opt level: O0

void __thiscall test_app::test_gzip(test_app *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  string *psVar6;
  long in_RDI;
  ostringstream oss_16;
  ostringstream oss_15;
  ostringstream oss_14;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  char *in_stack_ffffffffffffddd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdde0;
  test_app *in_stack_ffffffffffffde58;
  ostringstream *this_00;
  test_app *in_stack_ffffffffffffdfc0;
  undefined8 in_stack_ffffffffffffdfe8;
  undefined1 gzip;
  test_app *in_stack_ffffffffffffdff0;
  string local_1de8 [32];
  ostringstream local_1dc8 [383];
  undefined1 local_1c49;
  string local_1c48 [32];
  ostringstream local_1c28 [383];
  undefined1 local_1aa9;
  string local_1aa8 [32];
  ostringstream local_1a88 [383];
  undefined1 local_1909;
  string local_1908 [32];
  ostringstream local_18e8 [376];
  string local_1770 [32];
  string local_1750 [39];
  undefined1 local_1729;
  string local_1728 [32];
  ostringstream local_1708 [383];
  allocator local_1589;
  string local_1588 [39];
  undefined1 local_1561;
  string local_1560 [32];
  ostringstream local_1540 [383];
  undefined1 local_13c1;
  string local_13c0 [32];
  ostringstream local_13a0 [376];
  string local_1228 [39];
  undefined1 local_1201;
  string local_1200 [32];
  ostringstream local_11e0 [383];
  allocator local_1061;
  string local_1060 [39];
  undefined1 local_1039;
  string local_1038 [32];
  ostringstream local_1018 [383];
  undefined1 local_e99;
  string local_e98 [32];
  ostringstream local_e78 [376];
  string local_d00 [39];
  allocator local_cd9;
  string local_cd8 [39];
  undefined1 local_cb1;
  string local_cb0 [32];
  ostringstream local_c90 [383];
  allocator local_b11;
  string local_b10 [39];
  undefined1 local_ae9;
  string local_ae8 [32];
  ostringstream local_ac8 [383];
  undefined1 local_949;
  string local_948 [32];
  ostringstream local_928 [376];
  string local_7b0 [39];
  undefined1 local_789;
  string local_788 [32];
  ostringstream local_768 [383];
  undefined1 local_5e9;
  string local_5e8 [32];
  ostringstream local_5c8 [376];
  string local_450 [32];
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  undefined1 local_3b9;
  string local_3b8 [32];
  ostringstream local_398 [383];
  allocator local_219;
  string local_218 [32];
  string local_1f8 [39];
  undefined1 local_1d1;
  string local_1d0 [32];
  ostringstream local_1b0 [392];
  string local_28 [40];
  
  gzip = (undefined1)((ulong)in_stack_ffffffffffffdfe8 >> 0x38);
  poVar4 = std::operator<<((ostream *)&std::cout,"- Page Gzip");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  set_context(in_stack_ffffffffffffdff0,(bool)gzip);
  cppcms::application::cache();
  cppcms::cache_interface::clear();
  cppcms::application::request();
  cppcms::http::request::getenv_abi_cxx11_((char *)local_28);
  bVar1 = std::operator==(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_28);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar4 = std::operator<<((ostream *)local_1b0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x78);
    std::operator<<(poVar4," request().getenv(\"HTTP_ACCEPT_ENCODING\") == \"gzip, deflate\"");
    local_1d1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1d0);
    local_1d1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::application::request();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"HTTP_ACCEPT_ENCODING",&local_219);
  cppcms::http::request::getenv(local_1f8);
  bVar1 = std::operator==(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_398);
    poVar4 = std::operator<<((ostream *)local_398,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x79);
    std::operator<<(poVar4,
                    " request().getenv(std::string(\"HTTP_ACCEPT_ENCODING\")) == \"gzip, deflate\"")
    ;
    local_3b9 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_3b8);
    local_3b9 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar6 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"test",&local_3e1);
  cppcms::cache_interface::fetch_page(psVar6);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar4,"gzip");
  psVar6 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"test",&local_409);
  cppcms::cache_interface::store_page(psVar6,(int)local_408);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  str_abi_cxx11_(in_stack_ffffffffffffde58);
  std::__cxx11::string::substr((ulong)local_430,(ulong)local_450);
  bVar1 = std::operator==(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_430);
  std::__cxx11::string::~string(local_450);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_5c8);
    poVar4 = std::operator<<((ostream *)local_5c8,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7d);
    std::operator<<(poVar4," str().substr(0,2)==\"\\x1f\\x8b\"");
    local_5e9 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_5e8);
    local_5e9 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(byte *)(in_RDI + 0x48) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_768);
    poVar4 = std::operator<<((ostream *)local_768,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7e);
    std::operator<<(poVar4," gzip_");
    local_789 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_788);
    local_789 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  set_context(in_stack_ffffffffffffdff0,(bool)gzip);
  cppcms::application::request();
  cppcms::http::request::getenv_abi_cxx11_((char *)local_7b0);
  bVar1 = std::operator==(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_7b0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_928);
    poVar4 = std::operator<<((ostream *)local_928,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x82);
    std::operator<<(poVar4," request().getenv(\"HTTP_ACCEPT_ENCODING\") == \"\"");
    local_949 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_948);
    local_949 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = cache_size(in_stack_ffffffffffffdfc0);
  if (uVar3 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_ac8);
    poVar4 = std::operator<<((ostream *)local_ac8,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x83);
    std::operator<<(poVar4," cache_size() == 1");
    local_ae9 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_ae8);
    local_ae9 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar6 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b10,"test",&local_b11);
  bVar2 = cppcms::cache_interface::fetch_page(psVar6);
  std::__cxx11::string::~string(local_b10);
  std::allocator<char>::~allocator((allocator<char> *)&local_b11);
  if ((bVar2 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_c90);
    poVar4 = std::operator<<((ostream *)local_c90,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x85);
    std::operator<<(poVar4," cache().fetch_page(\"test\") ==false");
    local_cb1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_cb0);
    local_cb1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar4,"gzip");
  psVar6 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cd8,"test",&local_cd9);
  cppcms::cache_interface::store_page(psVar6,(int)local_cd8);
  std::__cxx11::string::~string(local_cd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
  str_abi_cxx11_(in_stack_ffffffffffffde58);
  bVar1 = std::operator==(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_d00);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_e78);
    poVar4 = std::operator<<((ostream *)local_e78,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x88);
    std::operator<<(poVar4," str() == \"gzip\"");
    local_e99 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_e98);
    local_e99 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(byte *)(in_RDI + 0x48) & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1018);
    poVar4 = std::operator<<((ostream *)local_1018,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x89);
    std::operator<<(poVar4," !gzip_");
    local_1039 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1038);
    local_1039 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  set_context(in_stack_ffffffffffffdff0,(bool)gzip);
  psVar6 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1060,"test",&local_1061);
  bVar2 = cppcms::cache_interface::fetch_page(psVar6);
  std::__cxx11::string::~string(local_1060);
  std::allocator<char>::~allocator((allocator<char> *)&local_1061);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_11e0);
    poVar4 = std::operator<<((ostream *)local_11e0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8c);
    std::operator<<(poVar4," cache().fetch_page(\"test\")");
    local_1201 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1200);
    local_1201 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  str_abi_cxx11_(in_stack_ffffffffffffde58);
  bVar1 = std::operator==(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_1228);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_13a0);
    poVar4 = std::operator<<((ostream *)local_13a0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8d);
    std::operator<<(poVar4," str()==\"gzip\"");
    local_13c1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_13c0);
    local_13c1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(byte *)(in_RDI + 0x48) & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1540);
    poVar4 = std::operator<<((ostream *)local_1540,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8e);
    std::operator<<(poVar4," !gzip_");
    local_1561 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1560);
    local_1561 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  set_context(in_stack_ffffffffffffdff0,(bool)gzip);
  psVar6 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1588,"test",&local_1589);
  bVar2 = cppcms::cache_interface::fetch_page(psVar6);
  std::__cxx11::string::~string(local_1588);
  std::allocator<char>::~allocator((allocator<char> *)&local_1589);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1708);
    poVar4 = std::operator<<((ostream *)local_1708,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x91);
    std::operator<<(poVar4," cache().fetch_page(\"test\")");
    local_1729 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1728);
    local_1729 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  str_abi_cxx11_(in_stack_ffffffffffffde58);
  std::__cxx11::string::substr((ulong)local_1750,(ulong)local_1770);
  bVar1 = std::operator==(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_1750);
  std::__cxx11::string::~string(local_1770);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_18e8);
    poVar4 = std::operator<<((ostream *)local_18e8,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x92);
    std::operator<<(poVar4," str().substr(0,2)==\"\\x1f\\x8b\"");
    local_1909 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1908);
    local_1909 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(byte *)(in_RDI + 0x48) & 1) == 0) {
    this_00 = local_1a88;
    std::__cxx11::ostringstream::ostringstream(this_00);
    poVar4 = std::operator<<((ostream *)this_00,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x93);
    std::operator<<(poVar4," gzip_");
    local_1aa9 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1aa8);
    local_1aa9 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  set_context(in_stack_ffffffffffffdff0,(bool)gzip);
  uVar3 = cache_size(in_stack_ffffffffffffdfc0);
  if (uVar3 == 2) {
    cppcms::application::cache();
    cppcms::cache_interface::clear();
    uVar3 = cache_size(in_stack_ffffffffffffdfc0);
    if (uVar3 == 0) {
      cppcms::application::release_context();
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x11c202);
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1dc8);
    poVar4 = std::operator<<((ostream *)local_1dc8,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x98);
    std::operator<<(poVar4," cache_size()==0");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1de8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_1c28);
  poVar4 = std::operator<<((ostream *)local_1c28,"Error ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x96);
  std::operator<<(poVar4," cache_size()==2");
  local_1c49 = 1;
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar5,local_1c48);
  local_1c49 = 0;
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_gzip()
	{
		std::cout << "- Page Gzip" << std::endl;
		set_context(true);
		cache().clear();
		TEST(request().getenv("HTTP_ACCEPT_ENCODING") == "gzip, deflate");
		TEST(request().getenv(std::string("HTTP_ACCEPT_ENCODING")) == "gzip, deflate");
		cache().fetch_page("test");
		response().out() << "gzip";
		cache().store_page("test");
		TEST(str().substr(0,2)=="\x1f\x8b");
		TEST(gzip_);
		
		set_context(false);
	
		TEST(request().getenv("HTTP_ACCEPT_ENCODING") == "");
		TEST(cache_size() == 1);

		TEST(cache().fetch_page("test") ==false);
		response().out() << "gzip";
		cache().store_page("test");
		TEST(str() == "gzip");
		TEST(!gzip_);

		set_context(false);
		TEST(cache().fetch_page("test"));
		TEST(str()=="gzip");
		TEST(!gzip_);

		set_context(true);
		TEST(cache().fetch_page("test"));
		TEST(str().substr(0,2)=="\x1f\x8b");
		TEST(gzip_);

		set_context(false);
		TEST(cache_size()==2);
		cache().clear();
		TEST(cache_size()==0);
		release_context();
	}